

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture3DShader::shadeFragments
          (Texture3DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  deUint32 dVar2;
  pointer pUVar3;
  Texture3D *this_00;
  GenericVec4 *pGVar4;
  Texture3DShader *pTVar5;
  int i;
  int iVar6;
  int iVar7;
  long lVar8;
  int fragNdx_1;
  int fragNdx;
  long lVar9;
  deInt32 *pdVar10;
  Vec4 *output;
  FragmentPacket *packet;
  IVec4 icolor;
  Vec4 coord;
  UVec4 uicolor;
  Vec4 texBias;
  Vec4 texScale;
  Vec3 texCoords [4];
  Vec4 colors [4];
  float local_128;
  deUint32 dStack_124;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  deInt32 local_fc;
  ulong local_f8;
  deUint32 local_f0;
  deUint32 local_ec;
  deUint32 local_e8;
  deUint32 local_e4;
  ulong local_e0;
  Texture3DShader *local_d8;
  FragmentPacket *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pUVar3 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8 = *(undefined8 *)&pUVar3[1].value;
  uStack_b0 = *(undefined8 *)((long)&pUVar3[1].value + 8);
  local_c8 = *(undefined8 *)&pUVar3[2].value;
  uStack_c0 = *(undefined8 *)((long)&pUVar3[2].value + 8);
  local_fc = pUVar3[3].value.i;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8._0_4_ = 0.0;
  local_a8._4_4_ = 0.0;
  local_a8._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  if (0 < numPackets) {
    local_e0 = (ulong)(uint)numPackets;
    local_f8 = 0;
    local_d8 = this;
    local_d0 = packets;
    do {
      pTVar5 = local_d8;
      this_00 = (((local_d8->super_ShaderProgram).m_uniforms.
                  super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                  super__Vector_impl_data._M_start)->sampler).tex3D;
      packet = local_d0 + local_f8;
      pdVar10 = (deInt32 *)(local_a8 + 8);
      lVar9 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_118,packet,context,0,(int)lVar9);
        *(undefined8 *)(pdVar10 + -2) = local_118;
        *pdVar10 = local_fc;
        lVar9 = lVar9 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar9 != 4);
      output = &local_78;
      sglr::rc::Texture3D::sample4(this_00,output,(Vec3 *)local_a8,0.0);
      DVar1 = pTVar5->m_outputType;
      pGVar4 = context->outputArray;
      iVar6 = (int)local_f8 * 4;
      lVar9 = 0;
      do {
        _local_128 = 0;
        uStack_120 = 0;
        lVar8 = 0;
        do {
          (&local_128)[lVar8] = output->m_data[lVar8] * *(float *)((long)&local_b8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_118 = 0;
        uStack_110 = 0;
        lVar8 = 0;
        do {
          *(float *)((long)&local_118 + lVar8 * 4) =
               (&local_128)[lVar8] + *(float *)((long)&local_c8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        castVectorSaturate<int>((Vec4 *)&local_118);
        castVectorSaturate<unsigned_int>((Vec4 *)&local_118);
        iVar7 = (int)lVar9;
        if (DVar1 == TYPE_UINT_VEC4) {
          lVar8 = (long)((iVar6 + iVar7) * context->numFragmentOutputs);
          pGVar4[lVar8].v.uData[0] = local_f0;
          pGVar4[lVar8].v.uData[1] = local_ec;
          pGVar4[lVar8].v.uData[2] = local_e8;
          dVar2 = local_e4;
LAB_012d0b07:
          pGVar4[lVar8].v.uData[3] = dVar2;
        }
        else {
          if (DVar1 == TYPE_INT_VEC4) {
            lVar8 = (long)((iVar6 + iVar7) * context->numFragmentOutputs);
            pGVar4[lVar8].v.uData[0] = (deUint32)local_128;
            pGVar4[lVar8].v.uData[1] = dStack_124;
            pGVar4[lVar8].v.uData[2] = (deUint32)uStack_120;
            dVar2 = uStack_120._4_4_;
            goto LAB_012d0b07;
          }
          if (DVar1 == TYPE_FLOAT_VEC4) {
            iVar7 = (iVar6 + iVar7) * context->numFragmentOutputs;
            pGVar4[iVar7].v.uData[0] = (deUint32)local_118;
            pGVar4[iVar7].v.uData[1] = local_118._4_4_;
            pGVar4[iVar7].v.uData[2] = (deUint32)uStack_110;
            pGVar4[iVar7].v.uData[3] = uStack_110._4_4_;
          }
        }
        lVar9 = lVar9 + 1;
        output = output + 1;
      } while (lVar9 != 4);
      local_f8 = local_f8 + 1;
    } while (local_f8 != local_e0);
  }
  return;
}

Assistant:

void Texture3DShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale	(m_uniforms[1].value.f4);
	const tcu::Vec4 texBias		(m_uniforms[2].value.f4);
	const float		depth		= m_uniforms[3].value.f;

	tcu::Vec3 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::Texture3D* tex = m_uniforms[0].sampler.tex3D;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec3(coord.x(), coord.y(), depth);
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}